

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O3

void GradientFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  uint8_t *preds;
  ulong uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  
  *filtered_data = *data;
  if (1 < width) {
    uVar1 = 0;
    do {
      filtered_data[uVar1 + 1] = data[uVar1 + 1] - data[uVar1];
      uVar1 = uVar1 + 1;
    } while (width - 1 != uVar1);
  }
  if (1 < height) {
    puVar2 = filtered_data + stride;
    puVar3 = data + stride;
    iVar4 = 1;
    do {
      filtered_data[stride] = data[stride] - *data;
      if (1 < width) {
        uVar1 = 1;
        do {
          iVar5 = ((uint)data[uVar1] + (uint)puVar3[uVar1 - 1]) - (uint)data[uVar1 - 1];
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          puVar2[uVar1] = puVar3[uVar1] - (char)iVar5;
          uVar1 = uVar1 + 1;
        } while ((uint)width != uVar1);
      }
      data = data + stride;
      filtered_data = filtered_data + stride;
      iVar4 = iVar4 + 1;
      puVar2 = puVar2 + stride;
      puVar3 = puVar3 + stride;
    } while (iVar4 != height);
  }
  return;
}

Assistant:

static WEBP_INLINE void DoGradientFilter_C(const uint8_t* in,
                                           int width, int height, int stride,
                                           int row, int num_rows,
                                           int inverse, uint8_t* out) {
  const uint8_t* preds;
  const size_t start_offset = row * stride;
  const int last_row = row + num_rows;
  SANITY_CHECK(in, out);
  in += start_offset;
  out += start_offset;
  preds = inverse ? out : in;

  // left prediction for top scan-line
  if (row == 0) {
    out[0] = in[0];
    PredictLine_C(in + 1, preds, out + 1, width - 1, inverse);
    row = 1;
    preds += stride;
    in += stride;
    out += stride;
  }

  // Filter line-by-line.
  while (row < last_row) {
    int w;
    // leftmost pixel: predict from above.
    PredictLine_C(in, preds - stride, out, 1, inverse);
    for (w = 1; w < width; ++w) {
      const int pred = GradientPredictor_C(preds[w - 1],
                                           preds[w - stride],
                                           preds[w - stride - 1]);
      out[w] = (uint8_t)(in[w] + (inverse ? pred : -pred));
    }
    ++row;
    preds += stride;
    in += stride;
    out += stride;
  }
}